

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void EndVisitCatch(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Scope *this;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ParseNodeCatch *pPVar5;
  FuncInfo *this_00;
  undefined4 *puVar6;
  FuncInfo *func;
  Scope *scope;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  
  pPVar5 = ParseNode::AsParseNodeCatch(pnode);
  this = pPVar5->scope;
  this_00 = Scope::GetFunc(this);
  bVar2 = Scope::HasInnerScopeIndex(this);
  if (((bVar2) && (bVar2 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator), !bVar2)) &&
     (bVar2 = Js::FunctionProxy::IsCoroutine(&this_00->byteCodeFunction->super_FunctionProxy),
     !bVar2)) {
    uVar3 = Scope::GetInnerScopeIndex(this);
    uVar4 = FuncInfo::CurrentInnerScopeIndex(this_00);
    if (uVar3 != uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0xa6,"(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex())",
                         "scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    FuncInfo::ReleaseInnerScopeIndex(this_00);
  }
  ByteCodeGenerator::PopScope(byteCodeGenerator);
  return;
}

Assistant:

void EndVisitCatch(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Scope *scope = pnode->AsParseNodeCatch()->scope;
    FuncInfo *func = scope->GetFunc();

    if (scope->HasInnerScopeIndex() && !(byteCodeGenerator->IsInDebugMode() || func->byteCodeFunction->IsCoroutine()))
    {
        // In debug mode (or for the generator/async function), don't release the current index, as we're giving each scope a unique index,
        // regardless of nesting.

        Assert(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex());
        func->ReleaseInnerScopeIndex();
    }

    byteCodeGenerator->PopScope();
}